

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O1

Matrix4f * operator*(Matrix4f *x,Matrix4f *y)

{
  float fVar1;
  float *pfVar2;
  int i;
  long lVar3;
  Matrix4f *product;
  float *in_RDI;
  float *pfVar4;
  int j;
  long lVar5;
  long lVar6;
  
  pfVar2 = in_RDI;
  in_RDI[0xc] = 0.0;
  in_RDI[0xd] = 0.0;
  *(undefined8 *)(in_RDI + 0xe) = 0;
  in_RDI[8] = 0.0;
  in_RDI[9] = 0.0;
  in_RDI[10] = 0.0;
  in_RDI[0xb] = 0.0;
  in_RDI[4] = 0.0;
  in_RDI[5] = 0.0;
  in_RDI[6] = 0.0;
  in_RDI[7] = 0.0;
  in_RDI[0] = 0.0;
  in_RDI[1] = 0.0;
  in_RDI[2] = 0.0;
  in_RDI[3] = 0.0;
  lVar3 = 0;
  do {
    lVar5 = 0;
    pfVar4 = y->m_elements;
    do {
      fVar1 = x->m_elements[lVar3 + lVar5 * 4];
      lVar6 = 0;
      do {
        *(float *)((long)in_RDI + lVar6) =
             *(float *)((long)pfVar4 + lVar6) * fVar1 + *(float *)((long)in_RDI + lVar6);
        lVar6 = lVar6 + 0x10;
      } while (lVar6 != 0x40);
      lVar5 = lVar5 + 1;
      pfVar4 = pfVar4 + 1;
    } while (lVar5 != 4);
    lVar3 = lVar3 + 1;
    in_RDI = in_RDI + 1;
  } while (lVar3 != 4);
  return (Matrix4f *)pfVar2;
}

Assistant:

Matrix4f operator * ( const Matrix4f& x, const Matrix4f& y )
{
	Matrix4f product; // zeroes

	for( int i = 0; i < 4; ++i )
	{
		for( int j = 0; j < 4; ++j )
		{
			for( int k = 0; k < 4; ++k )
			{
				product( i, k ) += x( i, j ) * y( j, k );
			}
		}
	}

	return product;
}